

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
cs::method_for::preprocess
          (method_for *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  token_base *ptVar2;
  instance_type *this_00;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  size_type sVar6;
  reference ptVar7;
  internal_error *this_01;
  compile_error *pcVar8;
  allocator local_31;
  string local_30;
  
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar4;
  local_30._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_30);
  if (*pptVar5 == (token_base *)0x0) {
    this_01 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_30,"Null pointer accessed.",&local_31);
    internal_error::internal_error(this_01,&local_30);
    __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_30._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_30);
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 0xf) {
    local_30._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_30);
    ptVar2 = *pptVar5;
    sVar6 = std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)(ptVar2 + 1));
    if (sVar6 == 3) {
      this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      ptVar7 = std::
               _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
               ::operator[]((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                             *)(ptVar2 + 2),0);
      instance_type::check_define_var(this_00,ptVar7->mRoot,true,false);
      return;
    }
    pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_30,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               &local_31);
    compile_error::compile_error(pcVar8,&local_30);
    __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
  }
  pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_30,
             "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
             &local_31);
  compile_error::compile_error(pcVar8,&local_30);
  __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void method_for::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (tree.root().data()->get_type() != token_types::parallel)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
		if (parallel_list.size() != 3)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		context->instance->check_define_var(parallel_list[0].root(), true);
	}